

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt.h
# Opt level: O0

ModelValues<mp::pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>_>
* __thiscall
mp::pre::ValuePresolverImpl::
RunPresolve<mp::pre::ModelValues<mp::pre::ValueMap<std::vector<mp::pre::VCString,std::allocator<mp::pre::VCString>>,int>>>
          (ValuePresolverImpl *this,LinkFn fn,
          ModelValues<mp::pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>_>
          *mv,ValueResolution vr)

{
  bool bVar1;
  long in_RCX;
  long *plVar2;
  ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_> *in_RDX;
  long in_RSI;
  ValuePresolverImpl *in_RDI;
  undefined4 in_R9D;
  LinkRange *br;
  const_iterator __end3;
  const_iterator __begin3;
  LinkRangeList *__range3;
  ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_>
  *in_stack_ffffffffffffff38;
  ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_>
  *in_stack_ffffffffffffff40;
  LinkIndexRange in_stack_ffffffffffffff68;
  ModelValues<mp::pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>_>
  *in_stack_ffffffffffffff70;
  _Deque_iterator<mp::pre::LinkRange,_const_mp::pre::LinkRange_&,_const_mp::pre::LinkRange_*>
  local_68;
  long local_48;
  undefined4 local_3c;
  ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_> *local_30;
  long local_28;
  
  local_3c = in_R9D;
  local_30 = in_RDX;
  local_28 = in_RCX;
  CleanUpValueNodes(in_RDI);
  ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>>::operator=
            (in_stack_ffffffffffffff40,
             (ModelValues<mp::pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>_>
              *)in_stack_ffffffffffffff38);
  local_48 = in_RSI + 0x2a8;
  std::deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>::begin
            ((deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_> *)
             in_stack_ffffffffffffff38);
  std::deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>::end
            ((deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_> *)
             in_stack_ffffffffffffff38);
  while (bVar1 = std::operator!=((_Self *)in_stack_ffffffffffffff40,
                                 (_Self *)in_stack_ffffffffffffff38), bVar1) {
    in_stack_ffffffffffffff70 =
         (ModelValues<mp::pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>_>
          *)std::
            _Deque_iterator<mp::pre::LinkRange,_const_mp::pre::LinkRange_&,_const_mp::pre::LinkRange_*>
            ::operator*(&local_68);
    plVar2 = (long *)((long)&(*(BasicLink **)&in_stack_ffffffffffffff70->name_)->_vptr_BasicLink +
                     local_28);
    in_stack_ffffffffffffff38 = local_30;
    if (((ulong)local_30 & 1) != 0) {
      in_stack_ffffffffffffff38 =
           *(ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_> **)
            ((long)local_30 + *plVar2 + -1);
    }
    in_stack_ffffffffffffff68 =
         *(LinkIndexRange *)&(in_stack_ffffffffffffff70->name_)._M_string_length;
    in_stack_ffffffffffffff40 = local_30;
    (*(code *)in_stack_ffffffffffffff38)(plVar2,in_stack_ffffffffffffff68,local_3c);
    std::_Deque_iterator<mp::pre::LinkRange,_const_mp::pre::LinkRange_&,_const_mp::pre::LinkRange_*>
    ::operator++((_Deque_iterator<mp::pre::LinkRange,_const_mp::pre::LinkRange_&,_const_mp::pre::LinkRange_*>
                  *)in_stack_ffffffffffffff40);
  }
  ModelValues<mp::pre::ValueMap<std::vector<mp::pre::VCString,std::allocator<mp::pre::VCString>>,int>>
  ::ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>>
            (in_stack_ffffffffffffff70,
             (ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_> *)
             in_stack_ffffffffffffff68);
  return (ModelValues<mp::pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>_>
          *)in_RDI;
}

Assistant:

ModelValues RunPresolve(LinkFn fn, const ModelValues& mv,
                          ValueResolution vr) const {
    CleanUpValueNodes();
    src_ = mv;
    for (const auto& br: brl_)
      (br.b_.*fn)(br.ir_, vr);
    return dest_;
  }